

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::BindingUniformSingleBlockTest::prepareNextTestCase
          (BindingUniformSingleBlockTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  GLchar *local_1b8 [3];
  MessageBuilder local_1a0;
  GLuint local_1c;
  BindingUniformSingleBlockTest *pBStack_18;
  GLuint test_case_index_local;
  BindingUniformSingleBlockTest *this_local;
  
  switch(test_case_index) {
  case 1:
    this->m_test_stage = TESS_CTRL_SHADER;
    break;
  case 2:
    this->m_test_stage = TESS_EVAL_SHADER;
    break;
  case 3:
    this->m_test_stage = GEOMETRY_SHADER;
    break;
  case 4:
    this->m_test_stage = FRAGMENT_SHADER;
    break;
  case 0xffffffff:
  case 0:
    this->m_test_stage = VERTEX_SHADER;
    break;
  default:
    return false;
  }
  local_1c = test_case_index;
  pBStack_18 = this;
  this_00 = deqp::Context::getTestContext
                      ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [15])"Tested stage: ");
  local_1b8[0] = Utils::getShaderStageName(this->m_test_stage);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return true;
}

Assistant:

bool BindingUniformSingleBlockTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		m_test_stage = Utils::VERTEX_SHADER;
		break;
	case 1:
		m_test_stage = Utils::TESS_CTRL_SHADER;
		break;
	case 2:
		m_test_stage = Utils::TESS_EVAL_SHADER;
		break;
	case 3:
		m_test_stage = Utils::GEOMETRY_SHADER;
		break;
	case 4:
		m_test_stage = Utils::FRAGMENT_SHADER;
		break;
	default:
		return false;
		break;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Tested stage: "
										<< Utils::getShaderStageName((Utils::SHADER_STAGES)m_test_stage)
										<< tcu::TestLog::EndMessage;

	return true;
}